

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWIAnalyzerResults.cpp
# Opt level: O0

void __thiscall
AtmelSWIAnalyzerResults::GenerateFrameTabularText
          (AtmelSWIAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  pointer *this_00;
  char *pcVar1;
  undefined1 local_110 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  texts_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  texts;
  Frame local_d0 [8];
  Frame f;
  ulonglong local_c0;
  char local_b0;
  char local_a8 [8];
  char number_str [128];
  int BUFF_SIZE;
  DisplayBase display_base_local;
  U64 frame_index_local;
  AtmelSWIAnalyzerResults *this_local;
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_d0);
  if (local_b0 == '\0') {
    if (local_c0 == 0) {
      AnalyzerResults::AddTabularText
                ((char *)this,"Token Wake",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else if (local_c0 == 2) {
      AnalyzerResults::AddTabularText
                ((char *)this,"Token One",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else if (local_c0 == 1) {
      AnalyzerResults::AddTabularText
                ((char *)this,"Token Zero",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else if (local_b0 == '\x01') {
    AnalyzerHelpers::GetNumberString(local_c0,display_base,8,local_a8,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,local_a8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else if (local_b0 == '\x04') {
    this_00 = &texts_1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
    GetTextsForChecksumFrame
              (local_d0,display_base,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&texts_1.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddTabularText
              ((char *)this,pcVar1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&texts_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else if (local_b0 == '\x02') {
    AnalyzerHelpers::GetNumberString(local_c0,display_base,8,local_a8,0x80);
    AnalyzerResults::AddTabularText((char *)this,"Bad Flag (",local_a8,")",(char *)0x0,(char *)0x0);
  }
  else if (local_b0 == '\x03') {
    AnalyzerHelpers::GetNumberString(local_c0,display_base,8,local_a8,0x80);
    AnalyzerResults::AddTabularText((char *)this,"Count (",local_a8,")",(char *)0x0,(char *)0x0);
  }
  else if (local_b0 == '\x05') {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_110);
    GetTextsForPacketSegmentFrame
              (this,local_d0,display_base,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_110,0);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddTabularText
              ((char *)this,pcVar1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_110);
  }
  Frame::~Frame(local_d0);
  return;
}

Assistant:

void AtmelSWIAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    /*Frame frame = GetFrame(frame_index);
    ClearResultStrings();

    char number_str[128];
    AnalyzerHelpers::GetNumberString(frame.mData1, display_base, 8, number_str, sizeof(number_str));
    AddResultString(number_str);*/

    ClearTabularText();

    const int BUFF_SIZE = 128;
    char number_str[ BUFF_SIZE ];

    Frame f = GetFrame( frame_index );

    if( f.mType == FrameToken )
    {
        if( f.mData1 == SWI_Wake )
        {
            AddTabularText( "Token Wake" );
        }
        else if( f.mData1 == SWI_One )
        {
            AddTabularText( "Token One" );
        }
        else if( f.mData1 == SWI_Zero )
        {
            AddTabularText( "Token Zero" );
        }
    }
    else if( f.mType == FrameByte )
    {
        AnalyzerHelpers::GetNumberString( f.mData1, display_base, 8, number_str, BUFF_SIZE );
        AddTabularText( number_str );
    }
    else if( f.mType == FrameChecksum )
    {
        std::vector<std::string> texts;
        GetTextsForChecksumFrame( f, display_base, texts );

        AddTabularText( texts[ 0 ].c_str() );
    }
    else if( f.mType == FrameFlag )
    {
        AnalyzerHelpers::GetNumberString( f.mData1, display_base, 8, number_str, BUFF_SIZE );
        AddTabularText( "Bad Flag (", number_str, ")" );
    }
    else if( f.mType == FrameCount )
    {
        AnalyzerHelpers::GetNumberString( f.mData1, display_base, 8, number_str, BUFF_SIZE );
        AddTabularText( "Count (", number_str, ")" );
    }
    else if( f.mType == FramePacketSegment )
    {
        std::vector<std::string> texts;
        GetTextsForPacketSegmentFrame( f, display_base, texts );
        AddTabularText( texts[ 0 ].c_str() );
    }
}